

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int iVar1;
  int *piVar2;
  DdNode *pDVar3;
  int iVar4;
  int iVar5;
  Extra_SymmInfo_t *pEVar6;
  void *__s;
  DdNode *n;
  long lVar7;
  size_t __size;
  DdNode *pDVar8;
  
  iVar5 = Extra_bddSuppSize(dd,bSupp);
  pEVar6 = Extra_SymmPairsAllocate(iVar5);
  iVar5 = dd->size;
  __size = (long)iVar5 << 2;
  __s = malloc(__size);
  memset(__s,0,__size);
  pEVar6->nVarsMax = iVar5;
  pEVar6->nNodes = 0;
  pDVar8 = dd->one;
  if (pDVar8 != bSupp) {
    piVar2 = pEVar6->pVars;
    lVar7 = 0;
    do {
      piVar2[lVar7] = bSupp->index;
      *(int *)((long)__s + (ulong)bSupp->index * 4) = (int)lVar7;
      bSupp = (bSupp->type).kids.T;
      lVar7 = lVar7 + 1;
    } while (bSupp != pDVar8);
  }
  Cudd_Ref(zPairs);
  pDVar8 = zPairs;
  if (dd->zero != zPairs) {
    do {
      do {
        dd->reordered = 0;
        n = extraZddSelectOneSubset(dd,pDVar8);
      } while (dd->reordered == 1);
      Cudd_Ref(n);
      pDVar3 = (n->type).kids.T;
      if ((pDVar3->type).kids.T != dd->one) {
        __assert_fail("cuddT( cuddT(zCube) ) == z1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                      ,0x145,
                      "Extra_SymmInfo_t *Extra_SymmPairsCreateFromZdd(DdManager *, DdNode *, DdNode *)"
                     );
      }
      iVar5 = *(int *)((long)__s + (ulong)(n->index >> 1) * 4);
      iVar1 = *(int *)((long)__s + (ulong)(pDVar3->index >> 1) * 4);
      iVar4 = iVar1;
      if (iVar5 < iVar1) {
        iVar4 = iVar5;
      }
      if (iVar1 < iVar5) {
        iVar1 = iVar5;
      }
      pEVar6->pSymms[iVar4][iVar1] = '\x01';
      pEVar6->nSymms = pEVar6->nSymms + 1;
      zPairs = Cudd_zddDiff(dd,pDVar8,n);
      Cudd_Ref(zPairs);
      Cudd_RecursiveDerefZdd(dd,pDVar8);
      Cudd_RecursiveDerefZdd(dd,n);
      pDVar8 = zPairs;
    } while (zPairs != dd->zero);
  }
  Cudd_RecursiveDerefZdd(dd,zPairs);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pEVar6;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    int i;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int * pMapVars2Nums;
    DdNode * bTemp;
    DdNode * zSet, * zCube, * zTemp;
    int iVar1, iVar2;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
//  p->nNodes   = Cudd_DagSize( zPairs );
    p->nNodes   = 0;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i] = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add these two variables to the data structure
        assert( cuddT( cuddT(zCube) ) == z1 );
        iVar1 = zCube->index/2;
        iVar2 = cuddT(zCube)->index/2;
        if ( pMapVars2Nums[iVar1] < pMapVars2Nums[iVar2] )
            p->pSymms[ pMapVars2Nums[iVar1] ][ pMapVars2Nums[iVar2] ] = 1;
        else
            p->pSymms[ pMapVars2Nums[iVar2] ][ pMapVars2Nums[iVar1] ] = 1;
        // count the symmetric pairs
        p->nSymms ++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );

    ABC_FREE( pMapVars2Nums );
    return p;

}